

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O1

void __thiscall Fl_Table::Fl_Table(Fl_Table *this,int X,int Y,int W,int H,char *l)

{
  Fl_Color FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fl_Scrollbar *pFVar9;
  Fl_Scroll *this_00;
  
  Fl_Group::Fl_Group(&this->super_Fl_Group,X,Y,W,H,l);
  (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Table_00279550;
  (this->_colwidths).arr = (int *)0x0;
  (this->_colwidths)._size = 0;
  (this->_rowheights).arr = (int *)0x0;
  (this->_rowheights)._size = 0;
  this->_rows = 0;
  this->_cols = 0;
  this->_row_header_w = 0x28;
  this->_col_header_h = 0x12;
  this->_row_header = '\0';
  this->_col_header = '\0';
  this->_row_resize = '\0';
  this->_col_resize = '\0';
  FVar1 = (this->super_Fl_Group).super_Fl_Widget.color_;
  this->_row_header_color = FVar1;
  this->_col_header_color = FVar1;
  this->_row_resize_min = 1;
  this->_col_resize_min = 1;
  this->_redraw_toprow = -1;
  this->_redraw_botrow = -1;
  this->_redraw_leftcol = -1;
  this->_redraw_rightcol = -1;
  this->leftcol = 0;
  this->rightcol = 0;
  this->table_w = 0;
  this->table_h = 0;
  this->toprow = 0;
  this->botrow = 0;
  this->toprow_scrollpos = -1;
  this->leftcol_scrollpos = -1;
  this->_last_cursor = FL_CURSOR_DEFAULT;
  this->_resizing_col = -1;
  this->_resizing_row = -1;
  this->_dragging_x = -1;
  this->_dragging_y = -1;
  this->_last_row = -1;
  this->_auto_drag = 0;
  this->current_row = -1;
  this->current_col = -1;
  this->select_row = -1;
  this->select_col = -1;
  (this->super_Fl_Group).super_Fl_Widget.box_ = '\t';
  pFVar9 = (Fl_Scrollbar *)operator_new(0xb8);
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar6 = Fl::scrollbar_size();
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar7 = Fl::scrollbar_size();
  iVar5 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar8 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(pFVar9,(iVar3 + iVar2) - iVar6,iVar4,iVar7,iVar5 - iVar8,(char *)0x0);
  this->vscrollbar = pFVar9;
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ = '\0';
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.callback_ = scroll_cb;
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_ = this;
  pFVar9 = (Fl_Scrollbar *)operator_new(0xb8);
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar6 = Fl::scrollbar_size();
  iVar5 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar7 = Fl::scrollbar_size();
  Fl_Scrollbar::Fl_Scrollbar(pFVar9,iVar2,(iVar4 + iVar3) - iVar6,iVar5,iVar7,(char *)0x0);
  this->hscrollbar = pFVar9;
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.type_ = '\x01';
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.callback_ = scroll_cb;
  (pFVar9->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.user_data_ = this;
  this_00 = (Fl_Scroll *)operator_new(0x228);
  Fl_Scroll::Fl_Scroll
            (this_00,(this->super_Fl_Group).super_Fl_Widget.x_,
             (this->super_Fl_Group).super_Fl_Widget.y_,(this->super_Fl_Group).super_Fl_Widget.w_,
             (this->super_Fl_Group).super_Fl_Widget.h_,(char *)0x0);
  this->table = this_00;
  (this_00->super_Fl_Group).super_Fl_Widget.box_ = '\0';
  (this_00->super_Fl_Group).super_Fl_Widget.type_ = '\0';
  (*(this_00->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])(this_00);
  Fl_Group::end(&this->table->super_Fl_Group);
  table_resized(this);
  Fl_Widget::redraw((Fl_Widget *)this);
  Fl_Group::end(&this->super_Fl_Group);
  Fl_Group::begin(&this->table->super_Fl_Group);
  return;
}

Assistant:

Fl_Table::Fl_Table(int X, int Y, int W, int H, const char *l) : Fl_Group(X,Y,W,H,l) {
  _rows             = 0;
  _cols             = 0;
  _row_header_w     = 40;
  _col_header_h     = 18;
  _row_header       = 0;
  _col_header       = 0;
  _row_header_color = color();
  _col_header_color = color();
  _row_resize       = 0;
  _col_resize       = 0;
  _row_resize_min   = 1;
  _col_resize_min   = 1;
  _redraw_toprow    = -1;
  _redraw_botrow    = -1;
  _redraw_leftcol   = -1;
  _redraw_rightcol  = -1;
  table_w           = 0;
  table_h           = 0;
  toprow            = 0;
  botrow            = 0;
  leftcol           = 0;
  rightcol          = 0;
  toprow_scrollpos  = -1;
  leftcol_scrollpos = -1;
  _last_cursor      = FL_CURSOR_DEFAULT;
  _resizing_col     = -1;
  _resizing_row     = -1;
  _dragging_x       = -1;
  _dragging_y       = -1;
  _last_row         = -1;
  _auto_drag        = 0;
  current_col	    = -1;
  current_row       = -1;
  select_row        = -1;
  select_col        = -1;
#if FLTK_ABI_VERSION >= 10301
  _scrollbar_size   = 0;
#endif  
#if FLTK_ABI_VERSION >= 10303
  flags_            = 0;	// TABCELLNAV off
#endif
  box(FL_THIN_DOWN_FRAME);
  
  vscrollbar = new Fl_Scrollbar(x()+w()-Fl::scrollbar_size(), y(),
                                Fl::scrollbar_size(), h()-Fl::scrollbar_size());
  vscrollbar->type(FL_VERTICAL);
  vscrollbar->callback(scroll_cb, (void*)this);
  
  hscrollbar = new Fl_Scrollbar(x(), y()+h()-Fl::scrollbar_size(),
                                w(), Fl::scrollbar_size());
  hscrollbar->type(FL_HORIZONTAL);
  hscrollbar->callback(scroll_cb, (void*)this);
  
  table = new Fl_Scroll(x(), y(), w(), h());
  table->box(FL_NO_BOX);
  table->type(0);		// don't show Fl_Scroll's scrollbars -- use our own
  table->hide();		// hide unless children are present
  table->end();
  
  table_resized();
  redraw();
  
  Fl_Group::end();		// end the group's begin()
  
  table->begin();		// leave with fltk children getting added to the scroll
}